

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadBoneAssignment(OgreBinarySerializer *this,VertexData *dest)

{
  DeadlyImportError *this_00;
  undefined1 local_5c [8];
  VertexBoneAssignment ba;
  allocator local_39;
  string local_38;
  VertexData *local_18;
  VertexData *dest_local;
  OgreBinarySerializer *this_local;
  
  local_18 = dest;
  dest_local = (VertexData *)this;
  if (dest == (VertexData *)0x0) {
    ba._7_1_ = 1;
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_38,"Cannot read bone assignments, vertex data is null.",&local_39);
    DeadlyImportError::DeadlyImportError(this_00,&local_38);
    ba._7_1_ = 0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  local_5c._0_4_ = Read<unsigned_int>(this);
  local_5c._4_2_ = Read<unsigned_short>(this);
  ba.vertexIndex = (uint32_t)Read<float>(this);
  std::
  vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>::
  push_back(&(local_18->super_IVertexData).boneAssignments,(value_type *)local_5c);
  return;
}

Assistant:

void OgreBinarySerializer::ReadBoneAssignment(VertexData *dest)
{
    if (!dest) {
        throw DeadlyImportError("Cannot read bone assignments, vertex data is null.");
    }

    VertexBoneAssignment ba;
    ba.vertexIndex = Read<uint32_t>();
    ba.boneIndex = Read<uint16_t>();
    ba.weight = Read<float>();

    dest->boneAssignments.push_back(ba);
}